

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void __thiscall Network::add(Network *this,Synapse *n_synapse)

{
  pointer *pppSVar1;
  pointer *pppPVar2;
  iterator __position;
  pointer ppPVar3;
  Population *pPVar4;
  iterator iVar5;
  pointer ppPVar6;
  vector<Population_*,_std::allocator<Population_*>_> *__range1;
  bool bVar7;
  Synapse *local_18;
  
  __position._M_current =
       (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_18 = n_synapse;
  if (__position._M_current ==
      (this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Synapse*,std::allocator<Synapse*>>::_M_realloc_insert<Synapse*const&>
              ((vector<Synapse*,std::allocator<Synapse*>> *)this,__position,&local_18);
  }
  else {
    *__position._M_current = n_synapse;
    pppSVar1 = &(this->synapses).super__Vector_base<Synapse_*,_std::allocator<Synapse_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  ppPVar6 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar3 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar7 = ppPVar6 != ppPVar3;
  if (bVar7) {
    pPVar4 = *ppPVar6;
    while (pPVar4 != local_18->from_population) {
      ppPVar6 = ppPVar6 + 1;
      bVar7 = ppPVar6 != ppPVar3;
      if (ppPVar6 == ppPVar3) break;
      pPVar4 = *ppPVar6;
    }
  }
  if (!bVar7) {
    iVar5._M_current =
         (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Population*,std::allocator<Population*>>::_M_realloc_insert<Population*const&>
                ((vector<Population*,std::allocator<Population*>> *)&this->populations,iVar5,
                 &local_18->from_population);
    }
    else {
      *iVar5._M_current = local_18->from_population;
      pppPVar2 = &(this->populations).
                  super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppPVar2 = *pppPVar2 + 1;
    }
  }
  ppPVar6 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar3 = (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar7 = ppPVar6 != ppPVar3;
  if (bVar7) {
    pPVar4 = *ppPVar6;
    while (pPVar4 != local_18->to_population) {
      ppPVar6 = ppPVar6 + 1;
      bVar7 = ppPVar6 != ppPVar3;
      if (ppPVar6 == ppPVar3) break;
      pPVar4 = *ppPVar6;
    }
  }
  if (!bVar7) {
    iVar5._M_current =
         (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->populations).super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Population*,std::allocator<Population*>>::_M_realloc_insert<Population*const&>
                ((vector<Population*,std::allocator<Population*>> *)&this->populations,iVar5,
                 &local_18->to_population);
    }
    else {
      *iVar5._M_current = local_18->to_population;
      pppPVar2 = &(this->populations).
                  super__Vector_base<Population_*,_std::allocator<Population_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppPVar2 = *pppPVar2 + 1;
    }
  }
  return;
}

Assistant:

void Network::add(Synapse* n_synapse) {
    synapses.push_back(n_synapse);
    if(!networkContainsPopulation(n_synapse->from_population))
        populations.push_back(n_synapse->from_population);
    if(!networkContainsPopulation(n_synapse->to_population))
        populations.push_back(n_synapse->to_population);
}